

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHMap.hpp
# Opt level: O2

bool __thiscall
Lib::DHMap<Kernel::Term_*,_int,_Lib::DefaultHash,_Lib::DefaultHash2>::set
          (DHMap<Kernel::Term_*,_int,_Lib::DefaultHash,_Lib::DefaultHash2> *this,Term *key,int val)

{
  uint uVar1;
  bool bVar2;
  Entry *pEVar3;
  uint uVar4;
  uint uVar5;
  Term *local_20;
  
  local_20 = key;
  ensureExpanded(this);
  pEVar3 = findEntryToInsert(this,&local_20);
  uVar5 = (uint)(pEVar3->field_0)._infoData >> 2;
  uVar1 = this->_timestamp;
  bVar2 = ((pEVar3->field_0)._infoData & 1U) != 0;
  if (bVar2 || uVar5 != uVar1) {
    if (uVar5 == uVar1) {
      this->_deleted = this->_deleted + -1;
      uVar4 = (pEVar3->field_0)._infoData & 0xfffffffe;
    }
    else {
      uVar4 = uVar1 << 2;
    }
    (pEVar3->field_0)._infoData = uVar4;
    pEVar3->_key = local_20;
    this->_size = this->_size + 1;
  }
  pEVar3->_val = val;
  return bVar2 || uVar5 != uVar1;
}

Assistant:

bool set(Key key, Val val)
  {
    ensureExpanded();
    Entry* e = findEntryToInsert(std::move(key));
    bool exists = e->_info.timestamp==_timestamp && !e->_info.deleted;
    if(!exists) {
      if(e->_info.timestamp!=_timestamp) {
	e->_info.timestamp=_timestamp;
	//no collision has occured on this entry while this _timestamp is set
	e->_info.collision=0;
      } else {
	ASS(e->_info.deleted);
	_deleted--;
      }
      e->_info.deleted=0;
      e->_key=key;
      _size++;
    }
    e->_val = std::move(val);
    return !exists;
  }